

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_app.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  mbedtls_entropy_context *crt;
  char *__s1;
  mbedtls_net_context server_fd;
  uint32_t flags;
  mbedtls_ssl_config conf;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_x509_crt cacert;
  mbedtls_x509_crl cacrl;
  mbedtls_entropy_context entropy;
  uchar buf [1024];
  char vrfy_buf [512];
  
  mbedtls_net_init(&server_fd);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  mbedtls_ssl_init(&ssl);
  mbedtls_ssl_config_init(&conf);
  mbedtls_x509_crt_init(&cacert);
  mbedtls_x509_crl_init(&cacrl);
  if (argc == 0) {
LAB_0011086d:
    printf(
          "\n usage: cert_app param=<>...\n\n acceptable parameters:\n    mode=file|ssl       default: none\n    filename=%%s         default: cert.crt\n    ca_file=%%s          The single file containing the top-level CA(s) you fully trust\n                        default: \"\" (none)\n    crl_file=%%s         The single CRL file you want to use\n                        default: \"\" (none)\n    ca_path=%%s          The path containing the top-level CA(s) you fully trust\n                        default: \"\" (none) (overrides ca_file)\n    server_name=%%s      default: localhost\n    server_port=%%d      default: 4433\n    debug_level=%%d      default: 0 (disabled)\n    permissive=%%d       default: 0 (disabled)\n\n"
          );
    uVar9 = 2;
    goto LAB_0011087e;
  }
  opt.mode = 0;
  opt.filename = "cert.crt";
  opt.ca_file = anon_var_dwarf_2a46a + 9;
  opt.crl_file = anon_var_dwarf_2a46a + 9;
  opt.ca_path = anon_var_dwarf_2a46a + 9;
  opt.server_name = "localhost";
  opt.server_port = "4433";
  opt.debug_level = 0;
  opt.permissive = 0;
  for (lVar15 = 1; lVar15 < argc; lVar15 = lVar15 + 1) {
    pcVar14 = argv[lVar15];
    pcVar11 = strchr(pcVar14,0x3d);
    if (pcVar11 == (char *)0x0) goto LAB_0011086d;
    __s1 = pcVar11 + 1;
    *pcVar11 = '\0';
    for (lVar12 = 0; pcVar14 + lVar12 < __s1; lVar12 = lVar12 + 1) {
      bVar1 = argv[lVar15][lVar12];
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        argv[lVar15][lVar12] = bVar1 | 0x20;
      }
    }
    iVar8 = strcmp(pcVar14,"mode");
    if (iVar8 == 0) {
      iVar8 = strcmp(__s1,"file");
      if (iVar8 == 0) {
        opt.mode = 1;
        pcVar11 = opt.filename;
        pcVar3 = opt.ca_file;
        pcVar4 = opt.crl_file;
        pcVar5 = opt.ca_path;
        pcVar6 = opt.server_name;
        pcVar7 = opt.server_port;
      }
      else {
        iVar8 = strcmp(__s1,"ssl");
        if (iVar8 != 0) goto LAB_0011086d;
        opt.mode = 2;
        pcVar11 = opt.filename;
        pcVar3 = opt.ca_file;
        pcVar4 = opt.crl_file;
        pcVar5 = opt.ca_path;
        pcVar6 = opt.server_name;
        pcVar7 = opt.server_port;
      }
    }
    else {
      iVar8 = strcmp(pcVar14,"filename");
      pcVar11 = __s1;
      pcVar3 = opt.ca_file;
      pcVar4 = opt.crl_file;
      pcVar5 = opt.ca_path;
      pcVar6 = opt.server_name;
      pcVar7 = opt.server_port;
      if (((((iVar8 != 0) &&
            (iVar8 = strcmp(pcVar14,"ca_file"), pcVar11 = opt.filename, pcVar3 = __s1,
            pcVar4 = opt.crl_file, pcVar5 = opt.ca_path, pcVar6 = opt.server_name,
            pcVar7 = opt.server_port, iVar8 != 0)) &&
           (iVar8 = strcmp(pcVar14,"crl_file"), pcVar11 = opt.filename, pcVar3 = opt.ca_file,
           pcVar4 = __s1, pcVar5 = opt.ca_path, pcVar6 = opt.server_name, pcVar7 = opt.server_port,
           iVar8 != 0)) &&
          ((iVar8 = strcmp(pcVar14,"ca_path"), pcVar11 = opt.filename, pcVar3 = opt.ca_file,
           pcVar4 = opt.crl_file, pcVar5 = __s1, pcVar6 = opt.server_name, pcVar7 = opt.server_port,
           iVar8 != 0 &&
           (iVar8 = strcmp(pcVar14,"server_name"), pcVar11 = opt.filename, pcVar3 = opt.ca_file,
           pcVar4 = opt.crl_file, pcVar5 = opt.ca_path, pcVar6 = __s1, pcVar7 = opt.server_port,
           iVar8 != 0)))) &&
         (iVar8 = strcmp(pcVar14,"server_port"), pcVar11 = opt.filename, pcVar3 = opt.ca_file,
         pcVar4 = opt.crl_file, pcVar5 = opt.ca_path, pcVar6 = opt.server_name, pcVar7 = __s1,
         iVar8 != 0)) {
        iVar8 = strcmp(pcVar14,"debug_level");
        if (iVar8 == 0) {
          uVar9 = atoi(__s1);
          opt.debug_level = uVar9;
          pcVar11 = opt.filename;
          pcVar3 = opt.ca_file;
          pcVar4 = opt.crl_file;
          pcVar5 = opt.ca_path;
          pcVar6 = opt.server_name;
          pcVar7 = opt.server_port;
          if (0xffff < uVar9) goto LAB_0011086d;
        }
        else {
          iVar8 = strcmp(pcVar14,"permissive");
          if (iVar8 != 0) goto LAB_0011086d;
          uVar9 = atoi(__s1);
          opt.permissive = uVar9;
          pcVar11 = opt.filename;
          pcVar3 = opt.ca_file;
          pcVar4 = opt.crl_file;
          pcVar5 = opt.ca_path;
          pcVar6 = opt.server_name;
          pcVar7 = opt.server_port;
          if (1 < uVar9) goto LAB_0011086d;
        }
      }
    }
    opt.server_port = pcVar7;
    opt.server_name = pcVar6;
    opt.ca_path = pcVar5;
    opt.crl_file = pcVar4;
    opt.ca_file = pcVar3;
    opt.filename = pcVar11;
  }
  uVar9 = 0;
  printf("  . Loading the CA root certificate ...");
  fflush(_stdout);
  if (*opt.ca_path != '\0') {
    uVar9 = mbedtls_x509_crt_parse_path(&cacert,opt.ca_path);
LAB_0011079c:
    if (-1 < (int)uVar9) {
      bVar2 = true;
      goto LAB_001107a5;
    }
    uVar13 = (ulong)-uVar9;
    pcVar14 = " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n";
LAB_001107ec:
    printf(pcVar14,uVar13);
    goto LAB_0011087e;
  }
  bVar2 = false;
  if (*opt.ca_file != '\0') {
    uVar9 = mbedtls_x509_crt_parse_file(&cacert,opt.ca_file);
    goto LAB_0011079c;
  }
LAB_001107a5:
  printf(" ok (%d skipped)\n",(ulong)uVar9);
  if (*opt.crl_file != '\0') {
    uVar9 = mbedtls_x509_crl_parse_file(&cacrl,opt.crl_file);
    if (uVar9 != 0) {
      uVar13 = (ulong)-uVar9;
      pcVar14 = " failed\n  !  mbedtls_x509_crl_parse returned -0x%x\n\n";
      goto LAB_001107ec;
    }
    bVar2 = true;
  }
  if (opt.mode == 2) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init(&entropy);
    uVar9 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"cert_app",8);
    if (uVar9 == 0) {
      puts(" ok");
      printf("  . SSL connection to tcp/%s/%s...",opt.server_name,opt.server_port);
      fflush(_stdout);
      uVar9 = mbedtls_net_connect(&server_fd,opt.server_name,opt.server_port,0);
      if (uVar9 == 0) {
        uVar9 = mbedtls_ssl_config_defaults(&conf,0,0,0);
        if (uVar9 != 0) {
          pcVar14 = " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n";
          uVar13 = (ulong)uVar9;
          goto LAB_001107ec;
        }
        if (bVar2) {
          mbedtls_ssl_conf_authmode(&conf,2);
          mbedtls_ssl_conf_ca_chain(&conf,&cacert,(mbedtls_x509_crl *)0x0);
          mbedtls_ssl_conf_verify(&conf,my_verify,(void *)0x0);
        }
        else {
          mbedtls_ssl_conf_authmode(&conf,0);
        }
        mbedtls_ssl_conf_rng(&conf,mbedtls_ctr_drbg_random,&ctr_drbg);
        mbedtls_ssl_conf_dbg(&conf,my_debug,_stdout);
        uVar9 = mbedtls_ssl_setup(&ssl,&conf);
        if (uVar9 == 0) {
          uVar9 = mbedtls_ssl_set_hostname(&ssl,opt.server_name);
          if (uVar9 == 0) {
            mbedtls_ssl_set_bio(&ssl,&server_fd,mbedtls_net_send,mbedtls_net_recv,
                                (mbedtls_ssl_recv_timeout_t *)0x0);
            do {
              uVar9 = mbedtls_ssl_handshake(&ssl);
              if (uVar9 == 0) {
                puts(" ok");
                puts("  . Peer certificate information    ...");
                uVar9 = mbedtls_x509_crt_info((char *)buf,0x3ff,"      ",(ssl.session)->peer_cert);
                if (uVar9 == 0xffffffff) {
                  pcVar14 = " failed\n  !  mbedtls_x509_crt_info returned %d\n\n";
                  uVar9 = 0xffffffff;
                  goto LAB_00110994;
                }
                puts((char *)buf);
                mbedtls_ssl_close_notify(&ssl);
                goto LAB_0011099d;
              }
            } while ((uVar9 & 0xffffff7f) == 0xffff9700);
            pcVar14 = " failed\n  ! mbedtls_ssl_handshake returned %d\n\n";
          }
          else {
            pcVar14 = " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n";
          }
        }
        else {
          pcVar14 = " failed\n  ! mbedtls_ssl_setup returned %d\n\n";
        }
      }
      else {
        pcVar14 = " failed\n  ! mbedtls_net_connect returned %d\n\n";
      }
    }
    else {
      pcVar14 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
    }
LAB_00110994:
    printf(pcVar14,(ulong)uVar9);
LAB_0011099d:
    mbedtls_ssl_free(&ssl);
    mbedtls_ssl_config_free(&conf);
    goto LAB_0011087e;
  }
  if (opt.mode != 1) goto LAB_0011086d;
  crt = &entropy;
  mbedtls_x509_crt_init((mbedtls_x509_crt *)crt);
  printf("\n  . Loading the certificate(s) ...");
  fflush(_stdout);
  uVar9 = mbedtls_x509_crt_parse_file((mbedtls_x509_crt *)crt,opt.filename);
  if ((int)uVar9 < 0) {
    pcVar14 = " failed\n  !  mbedtls_x509_crt_parse_file returned %d\n\n";
LAB_00110aa9:
    printf(pcVar14,(ulong)uVar9);
  }
  else {
    if ((uVar9 != 0) && (opt.permissive == 0)) {
      pcVar14 = " failed\n  !  mbedtls_x509_crt_parse failed to parse %d certificates\n\n";
      goto LAB_00110aa9;
    }
    puts(" ok");
    for (; crt != (mbedtls_entropy_context *)0x0;
        crt = *(mbedtls_entropy_context **)&crt->source[7].strong) {
      puts("  . Peer certificate information    ...");
      iVar8 = mbedtls_x509_crt_info((char *)buf,0x3ff,"      ",(mbedtls_x509_crt *)crt);
      if (iVar8 == -1) {
        pcVar14 = " failed\n  !  mbedtls_x509_crt_info returned %d\n\n";
        uVar9 = 0xffffffff;
        goto LAB_00110aa9;
      }
      puts((char *)buf);
    }
    if (bVar2) {
      uVar9 = 0;
      printf("  . Verifying X.509 certificate...");
      uVar10 = mbedtls_x509_crt_verify
                         ((mbedtls_x509_crt *)&entropy,&cacert,&cacrl,(char *)0x0,&flags,my_verify,
                          (void *)0x0);
      if (uVar10 == 0) {
        puts(" ok");
      }
      else {
        puts(" failed");
        mbedtls_x509_crt_verify_info(vrfy_buf,0x200,"  ! ",flags);
        puts(vrfy_buf);
        uVar9 = uVar10;
      }
    }
    else {
      uVar9 = 0;
    }
  }
  mbedtls_x509_crt_free((mbedtls_x509_crt *)&entropy);
LAB_0011087e:
  mbedtls_net_free(&server_fd);
  mbedtls_x509_crt_free(&cacert);
  mbedtls_x509_crl_free(&cacrl);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  uVar10 = 1;
  if (-1 < (int)uVar9) {
    uVar10 = uVar9;
  }
  return uVar10;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    mbedtls_net_context server_fd;
    unsigned char buf[1024];
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt cacert;
    mbedtls_x509_crl cacrl;
    int i, j;
    uint32_t flags;
    int verify = 0;
    char *p, *q;
    const char *pers = "cert_app";

    /*
     * Set to sane values
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_x509_crt_init( &cacert );
#if defined(MBEDTLS_X509_CRL_PARSE_C)
    mbedtls_x509_crl_init( &cacrl );
#else
    /* Zeroize structure as CRL parsing is not supported and we have to pass
       it to the verify function */
    memset( &cacrl, 0, sizeof(mbedtls_x509_crl) );
#endif

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        ret = 2;
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.ca_file             = DFL_CA_FILE;
    opt.crl_file            = DFL_CRL_FILE;
    opt.ca_path             = DFL_CA_PATH;
    opt.server_name         = DFL_SERVER_NAME;
    opt.server_port         = DFL_SERVER_PORT;
    opt.debug_level         = DFL_DEBUG_LEVEL;
    opt.permissive          = DFL_PERMISSIVE;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        for( j = 0; p + j < q; j++ )
        {
            if( argv[i][j] >= 'A' && argv[i][j] <= 'Z' )
                argv[i][j] |= 0x20;
        }

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "file" ) == 0 )
                opt.mode = MODE_FILE;
            else if( strcmp( q, "ssl" ) == 0 )
                opt.mode = MODE_SSL;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "ca_file" ) == 0 )
            opt.ca_file = q;
        else if( strcmp( p, "crl_file" ) == 0 )
            opt.crl_file = q;
        else if( strcmp( p, "ca_path" ) == 0 )
            opt.ca_path = q;
        else if( strcmp( p, "server_name" ) == 0 )
            opt.server_name = q;
        else if( strcmp( p, "server_port" ) == 0 )
            opt.server_port = q;
        else if( strcmp( p, "debug_level" ) == 0 )
        {
            opt.debug_level = atoi( q );
            if( opt.debug_level < 0 || opt.debug_level > 65535 )
                goto usage;
        }
        else if( strcmp( p, "permissive" ) == 0 )
        {
            opt.permissive = atoi( q );
            if( opt.permissive < 0 || opt.permissive > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    /*
     * 1.1. Load the trusted CA
     */
    mbedtls_printf( "  . Loading the CA root certificate ..." );
    fflush( stdout );

    if( strlen( opt.ca_path ) )
    {
        ret = mbedtls_x509_crt_parse_path( &cacert, opt.ca_path );
        verify = 1;
    }
    else if( strlen( opt.ca_file ) )
    {
        ret = mbedtls_x509_crt_parse_file( &cacert, opt.ca_file );
        verify = 1;
    }

    if( ret < 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( " ok (%d skipped)\n", ret );

#if defined(MBEDTLS_X509_CRL_PARSE_C)
    if( strlen( opt.crl_file ) )
    {
        if( ( ret = mbedtls_x509_crl_parse_file( &cacrl, opt.crl_file ) ) != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crl_parse returned -0x%x\n\n", -ret );
            goto exit;
        }

        verify = 1;
    }
#endif

    if( opt.mode == MODE_FILE )
    {
        mbedtls_x509_crt crt;
        mbedtls_x509_crt *cur = &crt;
        mbedtls_x509_crt_init( &crt );

        /*
         * 1.1. Load the certificate(s)
         */
        mbedtls_printf( "\n  . Loading the certificate(s) ..." );
        fflush( stdout );

        ret = mbedtls_x509_crt_parse_file( &crt, opt.filename );

        if( ret < 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse_file returned %d\n\n", ret );
            mbedtls_x509_crt_free( &crt );
            goto exit;
        }

        if( opt.permissive == 0 && ret > 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse failed to parse %d certificates\n\n", ret );
            mbedtls_x509_crt_free( &crt );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the certificate(s)
         */
        while( cur != NULL )
        {
            mbedtls_printf( "  . Peer certificate information    ...\n" );
            ret = mbedtls_x509_crt_info( (char *) buf, sizeof( buf ) - 1, "      ",
                                 cur );
            if( ret == -1 )
            {
                mbedtls_printf( " failed\n  !  mbedtls_x509_crt_info returned %d\n\n", ret );
                mbedtls_x509_crt_free( &crt );
                goto exit;
            }

            mbedtls_printf( "%s\n", buf );

            cur = cur->next;
        }

        ret = 0;

        /*
         * 1.3 Verify the certificate
         */
        if( verify )
        {
            mbedtls_printf( "  . Verifying X.509 certificate..." );

            if( ( ret = mbedtls_x509_crt_verify( &crt, &cacert, &cacrl, NULL, &flags,
                                         my_verify, NULL ) ) != 0 )
            {
                char vrfy_buf[512];

                mbedtls_printf( " failed\n" );

                mbedtls_x509_crt_verify_info( vrfy_buf, sizeof( vrfy_buf ), "  ! ", flags );

                mbedtls_printf( "%s\n", vrfy_buf );
            }
            else
                mbedtls_printf( " ok\n" );
        }

        mbedtls_x509_crt_free( &crt );
    }
    else if( opt.mode == MODE_SSL )
    {
        /*
         * 1. Initialize the RNG and the session data
         */
        mbedtls_printf( "\n  . Seeding the random number generator..." );
        fflush( stdout );

        mbedtls_entropy_init( &entropy );
        if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                                   (const unsigned char *) pers,
                                   strlen( pers ) ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
            goto ssl_exit;
        }

        mbedtls_printf( " ok\n" );

#if defined(MBEDTLS_DEBUG_C)
        mbedtls_debug_set_threshold( opt.debug_level );
#endif

        /*
         * 2. Start the connection
         */
        mbedtls_printf( "  . SSL connection to tcp/%s/%s...", opt.server_name,
                                                              opt.server_port );
        fflush( stdout );

        if( ( ret = mbedtls_net_connect( &server_fd, opt.server_name,
                                 opt.server_port, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
            goto ssl_exit;
        }

        /*
         * 3. Setup stuff
         */
        if( ( ret = mbedtls_ssl_config_defaults( &conf,
                        MBEDTLS_SSL_IS_CLIENT,
                        MBEDTLS_SSL_TRANSPORT_STREAM,
                        MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n", ret );
            goto exit;
        }

        if( verify )
        {
            mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_REQUIRED );
            mbedtls_ssl_conf_ca_chain( &conf, &cacert, NULL );
            mbedtls_ssl_conf_verify( &conf, my_verify, NULL );
        }
        else
            mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_NONE );

        mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
        mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

        if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_setup returned %d\n\n", ret );
            goto ssl_exit;
        }

        if( ( ret = mbedtls_ssl_set_hostname( &ssl, opt.server_name ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n", ret );
            goto ssl_exit;
        }

        mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

        /*
         * 4. Handshake
         */
        while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
            {
                mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned %d\n\n", ret );
                goto ssl_exit;
            }
        }

        mbedtls_printf( " ok\n" );

        /*
         * 5. Print the certificate
         */
        mbedtls_printf( "  . Peer certificate information    ...\n" );
        ret = mbedtls_x509_crt_info( (char *) buf, sizeof( buf ) - 1, "      ",
                             ssl.session->peer_cert );
        if( ret == -1 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_info returned %d\n\n", ret );
            goto ssl_exit;
        }

        mbedtls_printf( "%s\n", buf );

        mbedtls_ssl_close_notify( &ssl );

ssl_exit:
        mbedtls_ssl_free( &ssl );
        mbedtls_ssl_config_free( &conf );
    }
    else
        goto usage;

exit:

    mbedtls_net_free( &server_fd );
    mbedtls_x509_crt_free( &cacert );
#if defined(MBEDTLS_X509_CRL_PARSE_C)
    mbedtls_x509_crl_free( &cacrl );
#endif
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    if( ret < 0 )
        ret = 1;

    return( ret );
}